

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

bool CastToBool(valtype *vch)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  
  puVar2 = (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  bVar5 = uVar3 != 0;
  if (bVar5) {
    if (*puVar2 == '\0') {
      uVar4 = 1;
      do {
        bVar5 = uVar4 < uVar3;
        if (uVar3 <= uVar4) goto LAB_0041cfee;
        puVar1 = puVar2 + uVar4;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (*puVar1 == '\0');
    }
    uVar3 = 1;
  }
LAB_0041cfee:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return (bool)(bVar5 & (byte)uVar3);
}

Assistant:

bool CastToBool(const valtype& vch)
{
    for (unsigned int i = 0; i < vch.size(); i++)
    {
        if (vch[i] != 0)
        {
            // Can be negative zero
            if (i == vch.size()-1 && vch[i] == 0x80)
                return false;
            return true;
        }
    }
    return false;
}